

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O2

void __thiscall
absl::strings_internal::BigUnsigned<4>::BigUnsigned(BigUnsigned<4> *this,string_view sv)

{
  char *end;
  int n;
  char *pcVar1;
  char *begin;
  
  begin = sv._M_str;
  end = begin + sv._M_len;
  this->size_ = 0;
  this->words_[0] = 0;
  this->words_[1] = 0;
  this->words_[2] = 0;
  this->words_[3] = 0;
  pcVar1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<bool(*)(unsigned_char)>>
                     (begin,end,ascii_isdigit);
  if ((sv._M_len != 0) && (pcVar1 == end)) {
    n = ReadDigits(this,begin,end,0x27);
    if (0 < n) {
      MultiplyByTenToTheNth(this,n);
      return;
    }
  }
  return;
}

Assistant:

explicit BigUnsigned(absl::string_view sv) : size_(0), words_{} {
    // Check for valid input, returning a 0 otherwise.  This is reasonable
    // behavior only because this constructor is for unit tests.
    if (std::find_if_not(sv.begin(), sv.end(), ascii_isdigit) != sv.end() ||
        sv.empty()) {
      return;
    }
    int exponent_adjust =
        ReadDigits(sv.data(), sv.data() + sv.size(), Digits10() + 1);
    if (exponent_adjust > 0) {
      MultiplyByTenToTheNth(exponent_adjust);
    }
  }